

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<DomColorRole_*>::clear(QList<DomColorRole_*> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<DomColorRole_*> *this_00;
  __off_t __length;
  QArrayDataPointer<DomColorRole_*> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<DomColorRole_*> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  qsizetype alloc;
  QArrayDataPointer<DomColorRole_*> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<DomColorRole_*> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<DomColorRole_*>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<DomColorRole_*>::needsDetach(in_RDI);
    if (bVar2) {
      qVar3 = -0x5555555555555556;
      alloc = -0x5555555555555556;
      pQVar4 = (QArrayDataPointer<DomColorRole_*> *)0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<DomColorRole_*>::allocatedCapacity(in_RDI);
      QArrayDataPointer<DomColorRole_*>::QArrayDataPointer(pQVar4,alloc,qVar3,option);
      QArrayDataPointer<DomColorRole_*>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<DomColorRole_*>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<DomColorRole_*> *)
                QArrayDataPointer<DomColorRole_*>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<DomColorRole_*>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }